

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR CorUnix::CPalSynchronizationManager::Initialize(void)

{
  bool bVar1;
  LONG LVar2;
  int *Destination;
  CPalSynchronizationManager *local_18;
  CPalSynchronizationManager *pSynchManager;
  LONG lInit;
  PAL_ERROR palErr;
  
  pSynchManager._4_4_ = 0;
  local_18 = (CPalSynchronizationManager *)0x0;
  Destination = Volatile<int>::operator&((Volatile<int> *)&s_lInitStatus);
  LVar2 = InterlockedCompareExchange(Destination,1,0);
  if (LVar2 == 0) {
    InternalInitializeCriticalSection((CRITICAL_SECTION *)s_csSynchProcessLock);
    InternalInitializeCriticalSection((CRITICAL_SECTION *)s_csMonitoredProcessesLock);
    local_18 = InternalNew<CorUnix::CPalSynchronizationManager>();
    if (local_18 == (CPalSynchronizationManager *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      pSynchManager._4_4_ = 8;
    }
    else {
      bVar1 = CreateProcessPipe(local_18);
      if (bVar1) {
        g_pSynchronizationManager = local_18;
        s_pObjSynchMgr = local_18;
        Volatile<int>::operator=((Volatile<int> *)&s_lInitStatus,2);
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        pSynchManager._4_4_ = 0x6e;
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","Initialize",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x5d9);
    fprintf(_stderr,"Synchronization Manager already being initialized");
    pSynchManager._4_4_ = 0x54f;
  }
  if (pSynchManager._4_4_ != 0) {
    Volatile<int>::operator=((Volatile<int> *)&s_lInitStatus,5);
    if (local_18 != (CPalSynchronizationManager *)0x0) {
      ShutdownProcessPipe(local_18);
    }
    s_pObjSynchMgr = (CPalSynchronizationManager *)0x0;
    g_pSynchronizationManager = (CPalSynchronizationManager *)0x0;
    InternalDelete<CorUnix::CPalSynchronizationManager>(local_18);
  }
  return pSynchManager._4_4_;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::Initialize()
    {
        PAL_ERROR palErr = NO_ERROR;
        LONG lInit;
        CPalSynchronizationManager * pSynchManager = NULL;

        lInit = InterlockedCompareExchange(&s_lInitStatus,
                                           (LONG)SynchMgrStatusInitializing,
                                           (LONG)SynchMgrStatusIdle);
        if ((LONG)SynchMgrStatusIdle != lInit)
        {
            ASSERT("Synchronization Manager already being initialized");
            palErr = ERROR_INTERNAL_ERROR;
            goto I_exit;
        }

        InternalInitializeCriticalSection(&s_csSynchProcessLock);
        InternalInitializeCriticalSection(&s_csMonitoredProcessesLock);

        pSynchManager = InternalNew<CPalSynchronizationManager>();
        if (NULL == pSynchManager)
        {
            ERROR("Failed to allocate memory for Synchronization Manager");
            palErr = ERROR_NOT_ENOUGH_MEMORY;
            goto I_exit;
        }

        if (!pSynchManager->CreateProcessPipe())
        {
            ERROR("Unable to create process pipe \n");
            palErr = ERROR_OPEN_FAILED;
            goto I_exit;
        }

        s_pObjSynchMgr = pSynchManager;

        // Initialization was successful
        g_pSynchronizationManager =
            static_cast<IPalSynchronizationManager *>(pSynchManager);
        s_lInitStatus = (LONG)SynchMgrStatusRunning;

    I_exit:
        if (NO_ERROR != palErr)
        {
            s_lInitStatus = (LONG)SynchMgrStatusError;
            if (NULL != pSynchManager)
            {
                pSynchManager->ShutdownProcessPipe();
            }
            s_pObjSynchMgr = NULL;
            g_pSynchronizationManager = NULL;
            InternalDelete(pSynchManager);
        }

        return palErr;
    }